

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

var cs::function::call_rl(function *_this,vector *args)

{
  size_type sVar1;
  size_type sVar2;
  undefined8 uVar3;
  const_reference ppsVar4;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  long in_RSI;
  proxy *in_RDI;
  exception *e;
  statement_base *ptr;
  exception *e_1;
  size_t i;
  scope_guard scope;
  undefined1 in_stack_0000075f;
  iterator *in_stack_00000760;
  runtime_type *in_stack_00000768;
  context_t *in_stack_fffffffffffffe18;
  process_context *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  var *in_stack_ffffffffffffff00;
  any *in_stack_ffffffffffffff08;
  domain_manager *in_stack_ffffffffffffff10;
  ulong local_e0;
  
  process_context::poll_event(in_stack_fffffffffffffe20);
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x18));
  if (sVar1 != sVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RSI + 0x18));
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe58);
    std::operator+((char *)in_stack_fffffffffffffe28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe20);
    std::operator+(in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffe58);
    std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    runtime_error::runtime_error
              ((runtime_error *)in_stack_fffffffffffffe20,(string *)in_stack_fffffffffffffe18);
    __cxa_throw(uVar3,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  scope_guard::scope_guard((scope_guard *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_e0 = 0;
  while( true ) {
    sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    if (sVar1 <= local_e0) break;
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5cf547);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5cf553);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x18),local_e0);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,local_e0);
    domain_manager::add_var_no_return<std::__cxx11::string_const&>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    local_e0 = local_e0 + 1;
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5cf5e4);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5cf5f0);
  ppsVar4 = std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::front
                      (in_stack_fffffffffffffe30);
  statement_return::get_tree((statement_return *)*ppsVar4);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe18);
  runtime_type::parse_expr(in_stack_00000768,in_stack_00000760,(bool)in_stack_0000075f);
  scope_guard::~scope_guard((scope_guard *)0x5cf65b);
  return (var)in_RDI;
}

Assistant:

var function::call_rl(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		try {
			return _this->mContext->instance->parse_expr(static_cast<const statement_return *>(_this->mBody.front())->get_tree().root());
		}
		catch (const cs::exception &e) {
			throw e;
		}
		catch (const std::exception &e) {
			const statement_base *ptr = _this->mBody.front();
			throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
		}
	}